

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::select_multiple::add(select_multiple *this,string *opt,string *id,bool selected)

{
  element eStack_d8;
  
  element::element(&eStack_d8,id,opt,selected);
  std::
  vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
  ::emplace_back<cppcms::widgets::select_multiple::element>(&this->elements_,&eStack_d8);
  element::~element(&eStack_d8);
  return;
}

Assistant:

void select_multiple::add(std::string const &opt,std::string const &id,bool selected)
{
	elements_.push_back(element(id,opt,selected));
}